

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O3

void __thiscall
GainContainer::GainContainer
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment)

{
  vector<GainBuckets,_std::allocator<GainBuckets>_> *this_00;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *this_01;
  pointer *ppaVar1;
  pointer *ppCVar2;
  int *piVar3;
  pointer pvVar4;
  uint *puVar5;
  long lVar6;
  iterator __position;
  pointer paVar7;
  iterator __position_00;
  undefined4 uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cell;
  uint *puVar9;
  pointer pvVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  int gain;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *net;
  CellsInPartitions num_cells;
  uint max_gain;
  CellState local_50;
  uint local_3c;
  vector<GainBuckets,_std::allocator<GainBuckets>_> *local_38;
  
  this_00 = &this->buckets_;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar10 = (hypergraph->cells_).
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (hypergraph->cells_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar10 == pvVar4) {
    local_3c = 0;
  }
  else {
    local_3c = 0;
    do {
      uVar12 = (uint)((ulong)((long)(pvVar10->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar10->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
      if (uVar12 < local_3c) {
        uVar12 = local_3c;
      }
      local_3c = uVar12;
      pvVar10 = pvVar10 + 1;
    } while (pvVar10 != pvVar4);
  }
  this_01 = &this->num_cells_in_partitions_;
  local_38 = this_00;
  std::vector<GainBuckets,std::allocator<GainBuckets>>::emplace_back<unsigned_int&>
            ((vector<GainBuckets,std::allocator<GainBuckets>> *)this_00,&local_3c);
  std::vector<GainBuckets,std::allocator<GainBuckets>>::emplace_back<unsigned_int&>
            ((vector<GainBuckets,std::allocator<GainBuckets>> *)this_00,&local_3c);
  std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
  reserve(this_01,((long)(hypergraph->nets_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(hypergraph->nets_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar4 = (hypergraph->nets_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar10 = (hypergraph->nets_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar4; pvVar10 = pvVar10 + 1
      ) {
    local_50.iter._M_node = (_List_node_base *)0x0;
    puVar9 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar9 != puVar5) {
      lVar6 = (long)(partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      do {
        piVar3 = (int *)((long)&local_50.iter._M_node +
                        (ulong)((*(ulong *)(lVar6 + (ulong)(*puVar9 >> 6) * 8) >>
                                 ((ulong)*puVar9 & 0x3f) & 1) != 0) * 4);
        *piVar3 = *piVar3 + 1;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar5);
    }
    __position._M_current =
         (this->num_cells_in_partitions_).
         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->num_cells_in_partitions_).
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>::
      _M_realloc_insert<std::array<unsigned_int,2ul>const&>
                ((vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>
                  *)this_01,__position,(array<unsigned_int,_2UL> *)&local_50);
    }
    else {
      *(_List_node_base **)(__position._M_current)->_M_elems = local_50.iter._M_node;
      ppaVar1 = &(this->num_cells_in_partitions_).
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
  }
  std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::reserve
            (&this->cell_states_,
             ((long)(hypergraph->cells_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(hypergraph->cells_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar10 = (hypergraph->cells_).
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((hypergraph->cells_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar10) {
    uVar13 = 0;
    do {
      uVar14 = 1L << ((byte)uVar13 & 0x3f) &
               *(ulong *)((long)(partitionment->partitionment_).
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (uVar13 >> 6) * 8);
      puVar9 = pvVar10[uVar13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = pvVar10[uVar13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar9 == puVar5) {
        uVar11 = (ulong)(uVar14 != 0);
        gain = 0;
      }
      else {
        uVar11 = (ulong)(uVar14 != 0);
        paVar7 = (this_01->
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        gain = 0;
        do {
          iVar15 = 1;
          if (paVar7[*puVar9]._M_elems[uVar11] != 1) {
            iVar15 = -(uint)(paVar7[*puVar9]._M_elems[uVar14 == 0] == 0);
          }
          gain = gain + iVar15;
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar5);
      }
      local_50.iter =
           GainBuckets::addCell
                     ((GainBuckets *)
                      ((long)&(((local_38->
                                super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>).
                                _M_impl.super__Vector_impl_data._M_start)->container_).
                              super__Vector_base<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      + (ulong)(uint)((int)uVar11 * 0x28)),gain,(uint)uVar13);
      uVar8 = local_50._12_4_;
      local_50._12_4_ = local_50._12_4_ & 0xffffff00;
      __position_00._M_current =
           (this->cell_states_).
           super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_50.gain = gain;
      if (__position_00._M_current ==
          (this->cell_states_).
          super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::
        _M_realloc_insert<GainContainer::CellState>(&this->cell_states_,__position_00,&local_50);
      }
      else {
        uVar14 = CONCAT44(uVar8,gain) & 0xffffff00ffffffff;
        ((__position_00._M_current)->iter)._M_node = local_50.iter._M_node;
        (__position_00._M_current)->gain = (int)uVar14;
        (__position_00._M_current)->locked = (bool)(char)(uVar14 >> 0x20);
        *(int3 *)&(__position_00._M_current)->field_0xd = (int3)(uVar14 >> 0x28);
        ppCVar2 = &(this->cell_states_).
                   super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar2 = *ppCVar2 + 1;
      }
      uVar13 = (ulong)((uint)uVar13 + 1);
      pvVar10 = (hypergraph->cells_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(hypergraph->cells_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) *
               -0x5555555555555555;
    } while (uVar13 <= uVar14 && uVar14 - uVar13 != 0);
  }
  return;
}

Assistant:

GainContainer::GainContainer(const Hypergraph &hypergraph, const Partitionment &partitionment) {
  // create PartitionGains for both parts
  auto max_gain = hypergraph.getMaxAdjacency();
  for (unsigned i = 0; i < 2; ++i)
    buckets_.emplace_back(max_gain);
  // calculate number of cells in each partition for all nets
  num_cells_in_partitions_.reserve(hypergraph.getNets().size());
  for (const auto &net : hypergraph.getNets()) {
    CellsInPartitions num_cells{0, 0};
    for (unsigned cell : net)
      ++num_cells[partitionment[cell]];
    num_cells_in_partitions_.push_back(num_cells);
  }
  // calculate gains for all cells
  cell_states_.reserve(hypergraph.getCells().size());
  for (unsigned cell = 0; cell < hypergraph.getCells().size(); ++cell) {
    auto cell_part = partitionment[cell];
    int gain = 0;
    for (unsigned net : hypergraph.getCells()[cell])
      if (num_cells_in_partitions_[net][cell_part] == 1)
        ++gain;
      else if (num_cells_in_partitions_[net][OppositePart(cell_part)] == 0)
        --gain;
    cell_states_.push_back(CellState{buckets_[cell_part].addCell(gain, cell), gain, false});
  }
}